

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O3

int s2_semi_mgau_frame_eval
              (ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,int32 n_senone_active,
              mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  mfcc_t *pmVar4;
  char *pcVar5;
  undefined8 *puVar6;
  int *piVar7;
  float *pfVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  byte bVar13;
  int *piVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  uint uVar23;
  short sVar24;
  int iVar25;
  float *pfVar26;
  ulong uVar27;
  ps_mgaufuncs_t *ppVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  byte bVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  char cVar43;
  char cVar44;
  char cVar52;
  char cVar54;
  char cVar55;
  char cVar57;
  float fVar45;
  char cVar60;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 uVar53;
  undefined1 uVar56;
  char cVar58;
  undefined1 uVar59;
  undefined1 auVar51 [16];
  float fVar61;
  undefined1 auVar62 [12];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  byte local_98 [15];
  char cStack_89;
  byte local_88 [15];
  char cStack_79;
  byte local_78 [4];
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  long local_60;
  int local_54;
  long local_50;
  long local_48;
  mfcc_t **local_40;
  long local_38;
  
  lVar41 = (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24);
  local_40 = featbuf;
  memset(senone_scores,0,(long)ps[3].frame_idx * 2);
  local_54 = frame % ps[6].frame_idx;
  lVar17 = (long)local_54;
  ps[6].vt = (ps_mgaufuncs_t *)(&(ps[5].vt)->name)[lVar17];
  local_38 = lVar41;
  if (0 < lVar41) {
    uVar42 = (ulong)(uint)n_senone_active;
    lVar41 = 0;
    do {
      if (ps->frame_idx <= frame) {
        lVar15 = lVar17;
        if (local_54 == 0) {
          lVar15 = (long)ps[6].frame_idx;
        }
        memcpy((&(ps[6].vt)->name)[lVar41],
               *(void **)(*(long *)((long)ps[5].vt + lVar15 * 8 + -8) + lVar41 * 8),
               (long)(short)ps[4].frame_idx << 3);
        pmVar4 = local_40[lVar41];
        ppVar28 = ps[6].vt;
        sVar24 = (short)ps[4].frame_idx;
        if (0 < sVar24) {
          pcVar5 = (&ppVar28->name)[lVar41];
          iVar39 = *(int *)(*(long *)(*(long *)&ps[1].frame_idx + 0x30) + lVar41 * 4);
          uVar27 = 0;
          do {
            iVar25 = *(int *)(pcVar5 + uVar27 * 8 + 4);
            puVar6 = *(undefined8 **)&ps[1].frame_idx;
            fVar45 = *(float *)(*(long *)(*(long *)puVar6[2] + lVar41 * 8) + (long)iVar25 * 4);
            if (0 < iVar39) {
              lVar15 = (long)(iVar25 * iVar39) * 4;
              lVar33 = 0;
              do {
                fVar61 = (float)pmVar4[lVar33] -
                         *(float *)(lVar15 + **(long **)(*(long *)*puVar6 + lVar41 * 8) + lVar33 * 4
                                   );
                fVar45 = fVar45 - fVar61 * fVar61 *
                                  *(float *)(**(long **)(*(long *)puVar6[1] + lVar41 * 8) + lVar15 +
                                            lVar33 * 4);
                lVar33 = lVar33 + 1;
              } while (iVar39 != (int)lVar33);
            }
            fVar61 = -2.1474836e+09;
            if (-2.1474836e+09 <= fVar45) {
              fVar61 = fVar45;
            }
            iVar30 = (int)fVar61;
            *(int *)(pcVar5 + uVar27 * 8) = iVar30;
            uVar31 = uVar27;
            if (uVar27 != 0) {
              do {
                uVar34 = uVar31 - 1 & 0xffffffff;
                if (iVar30 <= *(int *)(pcVar5 + uVar34 * 8)) goto LAB_0013f8a3;
                *(undefined8 *)(pcVar5 + uVar31 * 8) = *(undefined8 *)(pcVar5 + uVar34 * 8);
                bVar12 = 1 < (long)uVar31;
                uVar31 = uVar31 - 1;
              } while (bVar12);
              uVar31 = 0;
LAB_0013f8a3:
              *(int *)(pcVar5 + (long)(int)uVar31 * 8) = iVar30;
              *(int *)(pcVar5 + (long)(int)uVar31 * 8 + 4) = iVar25;
              sVar24 = (short)ps[4].frame_idx;
            }
            uVar27 = uVar27 + 1;
          } while ((long)uVar27 < (long)sVar24);
          ppVar28 = ps[6].vt;
        }
        if (frame % (int)*(short *)((long)&ps[4].frame_idx + 2) == 0) {
          puVar6 = *(undefined8 **)&ps[1].frame_idx;
          iVar39 = *(int *)(puVar6 + 5);
          if (0 < (long)iVar39) {
            piVar7 = (int *)(&ppVar28->name)[lVar41];
            pfVar8 = *(float **)(*(long *)puVar6[2] + lVar41 * 8);
            iVar25 = *(int *)(puVar6[6] + lVar41 * 4);
            lVar33 = **(long **)(*(long *)puVar6[1] + lVar41 * 8);
            lVar15 = **(long **)(*(long *)*puVar6 + lVar41 * 8);
            pfVar26 = pfVar8;
            do {
              fVar45 = *pfVar26;
              if (0 < iVar25) {
                lVar22 = 0;
                lVar38 = 0;
                do {
                  if (fVar45 < (float)piVar7[(long)sVar24 * 2 + -2]) {
                    lVar15 = (lVar15 - lVar22) + (iVar25 - lVar38) * 4;
                    lVar33 = (lVar33 - lVar22) + (iVar25 - lVar38) * 4;
                    goto LAB_0013fa0c;
                  }
                  fVar61 = (float)pmVar4[lVar38] - *(float *)(lVar15 + lVar38 * 4);
                  fVar45 = fVar45 - fVar61 * fVar61 * *(float *)(lVar33 + lVar38 * 4);
                  lVar38 = lVar38 + 1;
                  lVar22 = lVar22 + -4;
                } while (iVar25 != (int)lVar38);
                lVar15 = lVar15 - lVar22;
                lVar33 = lVar33 - lVar22;
              }
              auVar62 = ZEXT812(0xcf000000);
              if (-2.1474836e+09 <= fVar45) {
                auVar62._4_8_ = auVar62._4_8_;
                auVar62._0_4_ = fVar45;
              }
              iVar30 = (int)auVar62._0_4_;
              if (piVar7[(long)sVar24 * 2 + -2] <= iVar30) {
                lVar22 = (long)(short)ps[4].frame_idx;
                iVar20 = (int)((ulong)((long)pfVar26 - (long)pfVar8) >> 2);
                piVar14 = piVar7 + (long)sVar24 * 2 + -4;
                if (0 < lVar22) {
                  lVar38 = 0;
                  do {
                    if (piVar7[lVar38 * 2 + 1] == iVar20) goto LAB_0013fa0c;
                    lVar38 = lVar38 + 1;
                  } while (lVar22 != lVar38);
                }
                for (; (piVar7 <= piVar14 && (*piVar14 <= iVar30)); piVar14 = piVar14 + -2) {
                  *(undefined8 *)(piVar14 + 2) = *(undefined8 *)piVar14;
                }
                piVar14[3] = iVar20;
                piVar14[2] = iVar30;
              }
LAB_0013fa0c:
              pfVar26 = pfVar26 + 1;
            } while (pfVar26 < pfVar8 + iVar39);
            ppVar28 = ps[6].vt;
            sVar24 = (short)ps[4].frame_idx;
          }
        }
        if (sVar24 < 1) {
          lVar15 = 0;
        }
        else {
          piVar7 = (int *)(&ppVar28->name)[lVar41];
          iVar39 = *piVar7;
          lVar15 = 0;
          do {
            iVar25 = (iVar39 >> 10) - (piVar7[lVar15 * 2] >> 10);
            if (0x5f < iVar25) {
              iVar25 = 0x60;
            }
            piVar7[lVar15 * 2] = iVar25;
            bVar19 = *(byte *)((long)&(ps[4].vt)->name + lVar41);
          } while (((bVar19 == 0) || (iVar25 <= (int)(uint)bVar19)) &&
                  (lVar15 = lVar15 + 1, lVar15 < (short)ps[4].frame_idx));
        }
        *(char *)(*(long *)(*(long *)&ps[5].frame_idx + lVar17 * 8) + lVar41) = (char)lVar15;
      }
      ppVar28 = ps[3].vt;
      if (ppVar28 == (ps_mgaufuncs_t *)0x0) {
        if (compallsen == 0) {
          bVar19 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar17 * 8) + lVar41);
          switch(bVar19) {
          case 1:
            if (0 < n_senone_active) {
              pcVar5 = (&(ps[6].vt)->name)[lVar41];
              lVar15 = *(long *)((&(ps[2].vt)->name)[lVar41] + (long)*(int *)(pcVar5 + 4) * 8);
              uVar3 = *(undefined4 *)pcVar5;
              uVar27 = 0;
              uVar31 = 0;
              do {
                uVar31 = (uVar31 & 0xffffffff) + (ulong)senone_active[uVar27];
                senone_scores[uVar31] =
                     senone_scores[uVar31] + (ushort)*(byte *)(lVar15 + uVar31) + (short)uVar3;
                uVar27 = uVar27 + 1;
              } while (uVar42 != uVar27);
            }
            break;
          case 2:
            if (0 < n_senone_active) {
              pcVar5 = (&(ps[2].vt)->name)[lVar41];
              piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
              lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
              lVar33 = *(long *)(pcVar5 + (long)piVar7[3] * 8);
              iVar39 = *piVar7;
              iVar25 = piVar7[2];
              pcVar5 = (ps[7].vt)->name;
              uVar27 = 0;
              uVar31 = 0;
              do {
                uVar31 = (uVar31 & 0xffffffff) + (ulong)senone_active[uVar27];
                iVar20 = (uint)*(byte *)(lVar15 + uVar31) + iVar39;
                iVar30 = (uint)*(byte *)(lVar33 + uVar31) + iVar25;
                uVar16 = iVar20 - iVar30;
                if (iVar20 < iVar30) {
                  iVar30 = iVar20;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                senone_scores[uVar31] =
                     senone_scores[uVar31] + ((short)iVar30 - (ushort)(byte)pcVar5[uVar29]);
                uVar27 = uVar27 + 1;
              } while (uVar42 != uVar27);
            }
            break;
          case 3:
            if (0 < n_senone_active) {
              pcVar5 = (&(ps[2].vt)->name)[lVar41];
              piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
              lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
              lVar33 = *(long *)(pcVar5 + (long)piVar7[3] * 8);
              lVar22 = *(long *)(pcVar5 + (long)piVar7[5] * 8);
              iVar39 = *piVar7;
              iVar25 = piVar7[2];
              pcVar5 = (ps[7].vt)->name;
              iVar30 = piVar7[4];
              uVar27 = 0;
              uVar31 = 0;
              do {
                uVar31 = (uVar31 & 0xffffffff) + (ulong)senone_active[uVar27];
                iVar35 = (uint)*(byte *)(lVar15 + uVar31) + iVar39;
                iVar20 = (uint)*(byte *)(lVar33 + uVar31) + iVar25;
                uVar16 = iVar35 - iVar20;
                if (iVar35 < iVar20) {
                  iVar20 = iVar35;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar20 = iVar20 - (uint)(byte)pcVar5[uVar29];
                iVar35 = (uint)*(byte *)(lVar22 + uVar31) + iVar30;
                uVar16 = iVar20 - iVar35;
                if (iVar20 < iVar35) {
                  iVar35 = iVar20;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                senone_scores[uVar31] =
                     senone_scores[uVar31] + ((short)iVar35 - (ushort)(byte)pcVar5[uVar29]);
                uVar27 = uVar27 + 1;
              } while (uVar42 != uVar27);
            }
            break;
          case 4:
            if (0 < n_senone_active) {
              pcVar5 = (&(ps[2].vt)->name)[lVar41];
              piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
              lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
              lVar33 = *(long *)(pcVar5 + (long)piVar7[3] * 8);
              lVar22 = *(long *)(pcVar5 + (long)piVar7[5] * 8);
              lVar38 = *(long *)(pcVar5 + (long)piVar7[7] * 8);
              iVar39 = *piVar7;
              iVar25 = piVar7[2];
              pcVar5 = (ps[7].vt)->name;
              iVar30 = piVar7[4];
              iVar20 = piVar7[6];
              uVar27 = 0;
              uVar31 = 0;
              do {
                uVar31 = (uVar31 & 0xffffffff) + (ulong)senone_active[uVar27];
                iVar36 = (uint)*(byte *)(lVar15 + uVar31) + iVar39;
                iVar35 = (uint)*(byte *)(lVar33 + uVar31) + iVar25;
                uVar16 = iVar36 - iVar35;
                if (iVar36 < iVar35) {
                  iVar35 = iVar36;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar35 = iVar35 - (uint)(byte)pcVar5[uVar29];
                iVar36 = (uint)*(byte *)(lVar22 + uVar31) + iVar30;
                uVar16 = iVar35 - iVar36;
                if (iVar35 < iVar36) {
                  iVar36 = iVar35;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar36 = iVar36 - (uint)(byte)pcVar5[uVar29];
                iVar35 = (uint)*(byte *)(lVar38 + uVar31) + iVar20;
                uVar16 = iVar36 - iVar35;
                if (iVar36 < iVar35) {
                  iVar35 = iVar36;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                senone_scores[uVar31] =
                     senone_scores[uVar31] + ((short)iVar35 - (ushort)(byte)pcVar5[uVar29]);
                uVar27 = uVar27 + 1;
              } while (uVar42 != uVar27);
            }
            break;
          case 5:
            if (0 < n_senone_active) {
              pcVar5 = (&(ps[2].vt)->name)[lVar41];
              piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
              lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
              lVar33 = *(long *)(pcVar5 + (long)piVar7[3] * 8);
              lVar22 = *(long *)(pcVar5 + (long)piVar7[5] * 8);
              lVar38 = *(long *)(pcVar5 + (long)piVar7[7] * 8);
              lVar10 = *(long *)(pcVar5 + (long)piVar7[9] * 8);
              iVar39 = *piVar7;
              iVar25 = piVar7[2];
              pcVar5 = (ps[7].vt)->name;
              iVar30 = piVar7[4];
              iVar20 = piVar7[6];
              iVar35 = piVar7[8];
              uVar31 = 0;
              uVar27 = 0;
              do {
                uVar27 = (uVar27 & 0xffffffff) + (ulong)senone_active[uVar31];
                iVar40 = (uint)*(byte *)(lVar15 + uVar27) + iVar39;
                iVar36 = (uint)*(byte *)(lVar33 + uVar27) + iVar25;
                uVar16 = iVar40 - iVar36;
                if (iVar40 < iVar36) {
                  iVar36 = iVar40;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar36 = iVar36 - (uint)(byte)pcVar5[uVar29];
                iVar40 = (uint)*(byte *)(lVar22 + uVar27) + iVar30;
                uVar16 = iVar36 - iVar40;
                if (iVar36 < iVar40) {
                  iVar40 = iVar36;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar40 = iVar40 - (uint)(byte)pcVar5[uVar29];
                iVar36 = (uint)*(byte *)(lVar38 + uVar27) + iVar20;
                uVar16 = iVar40 - iVar36;
                if (iVar40 < iVar36) {
                  iVar36 = iVar40;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar36 = iVar36 - (uint)(byte)pcVar5[uVar29];
                iVar40 = (uint)*(byte *)(lVar10 + uVar27) + iVar35;
                uVar16 = iVar36 - iVar40;
                if (iVar36 < iVar40) {
                  iVar40 = iVar36;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                senone_scores[uVar27] =
                     senone_scores[uVar27] + ((short)iVar40 - (ushort)(byte)pcVar5[uVar29]);
                uVar31 = uVar31 + 1;
              } while (uVar42 != uVar31);
            }
            break;
          case 6:
            if (0 < n_senone_active) {
              pcVar5 = (&(ps[2].vt)->name)[lVar41];
              piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
              lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
              local_60 = *(long *)(pcVar5 + (long)piVar7[3] * 8);
              local_48 = *(long *)(pcVar5 + (long)piVar7[5] * 8);
              local_50 = *(long *)(pcVar5 + (long)piVar7[7] * 8);
              lVar33 = *(long *)(pcVar5 + (long)piVar7[9] * 8);
              lVar22 = *(long *)(pcVar5 + (long)piVar7[0xb] * 8);
              iVar39 = *piVar7;
              iVar25 = piVar7[2];
              pcVar5 = (ps[7].vt)->name;
              iVar30 = piVar7[4];
              iVar20 = piVar7[6];
              iVar35 = piVar7[8];
              iVar36 = piVar7[10];
              uVar27 = 0;
              uVar31 = 0;
              do {
                uVar31 = (uVar31 & 0xffffffff) + (ulong)senone_active[uVar27];
                iVar21 = (uint)*(byte *)(lVar15 + uVar31) + iVar39;
                iVar40 = (uint)*(byte *)(local_60 + uVar31) + iVar25;
                uVar16 = iVar21 - iVar40;
                if (iVar21 < iVar40) {
                  iVar40 = iVar21;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar40 = iVar40 - (uint)(byte)pcVar5[uVar29];
                iVar21 = (uint)*(byte *)(local_48 + uVar31) + iVar30;
                uVar16 = iVar40 - iVar21;
                if (iVar40 < iVar21) {
                  iVar21 = iVar40;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar21 = iVar21 - (uint)(byte)pcVar5[uVar29];
                iVar40 = (uint)*(byte *)(local_50 + uVar31) + iVar20;
                uVar16 = iVar21 - iVar40;
                if (iVar21 < iVar40) {
                  iVar40 = iVar21;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar40 = iVar40 - (uint)(byte)pcVar5[uVar29];
                iVar21 = (uint)*(byte *)(lVar33 + uVar31) + iVar35;
                uVar16 = iVar40 - iVar21;
                if (iVar40 < iVar21) {
                  iVar21 = iVar40;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                iVar21 = iVar21 - (uint)(byte)pcVar5[uVar29];
                iVar40 = (uint)*(byte *)(lVar22 + uVar31) + iVar36;
                uVar16 = iVar21 - iVar40;
                if (iVar21 < iVar40) {
                  iVar40 = iVar21;
                }
                uVar29 = -uVar16;
                if (0 < (int)uVar16) {
                  uVar29 = uVar16;
                }
                senone_scores[uVar31] =
                     senone_scores[uVar31] + ((short)iVar40 - (ushort)(byte)pcVar5[uVar29]);
                uVar27 = uVar27 + 1;
              } while (uVar42 != uVar27);
            }
            break;
          default:
            if (0 < n_senone_active) {
              pcVar5 = (&(ps[2].vt)->name)[lVar41];
              piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
              lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
              iVar39 = *piVar7;
              uVar27 = 0;
              uVar31 = 0;
              do {
                uVar31 = (uVar31 & 0xffffffff) + (ulong)senone_active[uVar27];
                iVar25 = (uint)*(byte *)(lVar15 + uVar31) + iVar39;
                if (1 < bVar19) {
                  lVar33 = 0;
                  do {
                    iVar30 = (uint)*(byte *)(*(long *)(pcVar5 + (long)piVar7[lVar33 * 2 + 3] * 8) +
                                            uVar31) + piVar7[lVar33 * 2 + 2];
                    uVar16 = iVar25 - iVar30;
                    if (iVar25 < iVar30) {
                      iVar30 = iVar25;
                    }
                    uVar29 = -uVar16;
                    if (0 < (int)uVar16) {
                      uVar29 = uVar16;
                    }
                    iVar25 = iVar30 - (uint)(byte)(ps[7].vt)->name[uVar29];
                    lVar33 = lVar33 + 1;
                  } while ((ulong)bVar19 - 1 != lVar33);
                }
                senone_scores[uVar31] = senone_scores[uVar31] + (short)iVar25;
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar42);
            }
          }
        }
        else {
          iVar39 = ps[3].frame_idx;
          if (0 < (long)iVar39) {
            bVar19 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar17 * 8) + lVar41);
            pcVar5 = (&(ps[2].vt)->name)[lVar41];
            piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
            lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
            iVar25 = *piVar7;
            lVar33 = 0;
            do {
              iVar30 = (uint)*(byte *)(lVar15 + lVar33) + iVar25;
              if (1 < bVar19) {
                lVar22 = 0;
                do {
                  iVar20 = (uint)*(byte *)(*(long *)(pcVar5 + (long)piVar7[lVar22 * 2 + 3] * 8) +
                                          lVar33) + piVar7[lVar22 * 2 + 2];
                  uVar16 = iVar30 - iVar20;
                  if (iVar30 < iVar20) {
                    iVar20 = iVar30;
                  }
                  uVar29 = -uVar16;
                  if (0 < (int)uVar16) {
                    uVar29 = uVar16;
                  }
                  iVar30 = iVar20 - (uint)(byte)(ps[7].vt)->name[uVar29];
                  lVar22 = lVar22 + 1;
                } while ((ulong)bVar19 - 1 != lVar22);
              }
              senone_scores[lVar33] = senone_scores[lVar33] + (short)iVar30;
              lVar33 = lVar33 + 1;
            } while (lVar33 != iVar39);
          }
        }
      }
      else if (compallsen == 0) {
        bVar19 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar17 * 8) + lVar41);
        switch(bVar19) {
        case 1:
          pcVar5 = (&(ps[6].vt)->name)[lVar41];
          uVar3 = *(undefined4 *)pcVar5;
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar46._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar46[3] = uVar53;
          auVar46[2] = uVar53;
          auVar46[0] = (undefined1)uVar3;
          auVar46[1] = auVar46[0];
          auVar46._8_8_ = 0;
          auVar51 = pshuflw(auVar46,auVar46,0);
          cVar43 = auVar51[0];
          local_c8[0] = *(char *)&ppVar28->name + cVar43;
          cVar52 = auVar51[1];
          local_c8[1] = *(char *)((long)&ppVar28->name + 1) + cVar52;
          cVar55 = auVar51[2];
          local_c8[2] = *(char *)((long)&ppVar28->name + 2) + cVar55;
          cVar58 = auVar51[3];
          local_c8[3] = *(char *)((long)&ppVar28->name + 3) + cVar58;
          local_c8[4] = *(char *)((long)&ppVar28->name + 4) + cVar43;
          local_c8[5] = *(char *)((long)&ppVar28->name + 5) + cVar52;
          local_c8[6] = *(char *)((long)&ppVar28->name + 6) + cVar55;
          local_c8[7] = *(char *)((long)&ppVar28->name + 7) + cVar58;
          local_c8[8] = *(char *)&ppVar28->frame_eval + cVar43;
          local_c8[9] = *(undefined1 *)((long)&ppVar28->frame_eval + 1) + cVar52;
          local_c8[10] = *(undefined1 *)((long)&ppVar28->frame_eval + 2) + cVar55;
          local_c8[0xb] = *(undefined1 *)((long)&ppVar28->frame_eval + 3) + cVar58;
          local_c8[0xc] = *(undefined1 *)((long)&ppVar28->frame_eval + 4) + cVar43;
          local_c8[0xd] = *(undefined1 *)((long)&ppVar28->frame_eval + 5) + cVar52;
          local_c8[0xe] = *(undefined1 *)((long)&ppVar28->frame_eval + 6) + cVar55;
          local_c8[0xf] = *(undefined1 *)((long)&ppVar28->frame_eval + 7) + cVar58;
          if (0 < n_senone_active) {
            lVar15 = *(long *)((&(ps[2].vt)->name)[lVar41] + (long)*(int *)(pcVar5 + 4) * 8);
            uVar27 = 0;
            uVar31 = 0;
            do {
              uVar16 = (int)uVar31 + (uint)senone_active[uVar27];
              uVar31 = (ulong)uVar16;
              bVar19 = *(byte *)(lVar15 + (ulong)(uVar16 >> 1));
              bVar18 = bVar19 >> 4;
              if ((uVar16 & 1) == 0) {
                bVar18 = bVar19 & 0xf;
              }
              senone_scores[uVar31] = senone_scores[uVar31] + (ushort)(byte)local_c8[bVar18];
              uVar27 = uVar27 + 1;
            } while (uVar42 != uVar27);
          }
          break;
        case 2:
          pcVar5 = (&(ps[6].vt)->name)[lVar41];
          uVar3 = *(undefined4 *)pcVar5;
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar50._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar50[3] = uVar53;
          auVar50[2] = uVar53;
          auVar50[0] = (undefined1)uVar3;
          auVar50[1] = auVar50[0];
          auVar50._8_8_ = 0;
          auVar51 = pshuflw(auVar50,auVar50,0);
          uVar3 = *(undefined4 *)(pcVar5 + 8);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar66._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar66[3] = uVar53;
          auVar66[2] = uVar53;
          auVar66[0] = (undefined1)uVar3;
          auVar66[1] = auVar66[0];
          auVar66._8_8_ = 0;
          auVar67 = pshuflw(auVar66,auVar66,0);
          uVar1 = ppVar28->name;
          uVar2 = ppVar28->frame_eval;
          cVar43 = auVar51[0];
          cVar52 = auVar51[1];
          cVar72 = (char)((ulong)uVar1 >> 8);
          cVar55 = auVar51[2];
          cVar73 = (char)((ulong)uVar1 >> 0x10);
          cVar58 = auVar51[3];
          cVar74 = (char)((ulong)uVar1 >> 0x18);
          cVar75 = (char)((ulong)uVar1 >> 0x20);
          cVar76 = (char)((ulong)uVar1 >> 0x28);
          cVar77 = (char)((ulong)uVar1 >> 0x30);
          cVar78 = (char)((ulong)uVar1 >> 0x38);
          cVar79 = (char)((ulong)uVar2 >> 8);
          cVar80 = (char)((ulong)uVar2 >> 0x10);
          cVar81 = (char)((ulong)uVar2 >> 0x18);
          cVar82 = (char)((ulong)uVar2 >> 0x20);
          cVar83 = (char)((ulong)uVar2 >> 0x28);
          cVar44 = (char)((ulong)uVar2 >> 0x30);
          cVar54 = (char)((ulong)uVar2 >> 0x38);
          local_c8[1] = cVar52 + cVar72;
          local_c8[0] = cVar43 + (char)uVar1;
          local_c8[2] = cVar55 + cVar73;
          local_c8[3] = cVar58 + cVar74;
          local_c8[4] = cVar43 + cVar75;
          local_c8[5] = cVar52 + cVar76;
          local_c8[6] = cVar55 + cVar77;
          local_c8[7] = cVar58 + cVar78;
          local_c8[8] = cVar43 + (char)uVar2;
          local_c8[9] = cVar52 + cVar79;
          local_c8[10] = cVar55 + cVar80;
          local_c8[0xb] = cVar58 + cVar81;
          local_c8[0xc] = cVar43 + cVar82;
          local_c8[0xd] = cVar52 + cVar83;
          local_c8[0xe] = cVar55 + cVar44;
          local_c8[0xf] = cVar58 + cVar54;
          cVar43 = auVar67[0];
          local_b8[0] = cVar43 + (char)uVar1;
          cVar52 = auVar67[1];
          local_b8[1] = cVar52 + cVar72;
          cVar55 = auVar67[2];
          local_b8[2] = cVar55 + cVar73;
          cVar58 = auVar67[3];
          local_b8[3] = cVar58 + cVar74;
          local_b8[4] = cVar43 + cVar75;
          local_b8[5] = cVar52 + cVar76;
          local_b8[6] = cVar55 + cVar77;
          local_b8[7] = cVar58 + cVar78;
          local_b8[8] = cVar43 + (char)uVar2;
          local_b8[9] = cVar52 + cVar79;
          local_b8[10] = cVar55 + cVar80;
          local_b8[0xb] = cVar58 + cVar81;
          local_b8[0xc] = cVar43 + cVar82;
          local_b8[0xd] = cVar52 + cVar83;
          local_b8[0xe] = cVar55 + cVar44;
          local_b8[0xf] = cVar58 + cVar54;
          if (0 < n_senone_active) {
            pcVar9 = (&(ps[2].vt)->name)[lVar41];
            lVar15 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 4) * 8);
            lVar33 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0xc) * 8);
            pcVar5 = (ps[7].vt)->name;
            uVar27 = 0;
            uVar31 = 0;
            do {
              uVar16 = (int)uVar31 + (uint)senone_active[uVar27];
              uVar31 = (ulong)uVar16;
              bVar19 = *(byte *)(lVar15 + (ulong)(uVar16 >> 1));
              bVar18 = *(byte *)(lVar33 + (ulong)(uVar16 >> 1));
              bVar32 = bVar19 >> 4;
              bVar13 = bVar18 >> 4;
              if ((uVar16 & 1) == 0) {
                bVar32 = bVar19 & 0xf;
                bVar13 = bVar18 & 0xf;
              }
              bVar19 = local_b8[bVar13];
              uVar29 = (uint)(byte)local_c8[bVar32];
              uVar37 = uVar29 - bVar19;
              uVar16 = (uint)bVar19;
              if (uVar29 < bVar19) {
                uVar16 = uVar29;
              }
              uVar29 = -uVar37;
              if (0 < (int)uVar37) {
                uVar29 = uVar37;
              }
              senone_scores[uVar31] =
                   senone_scores[uVar31] + ((short)uVar16 - (ushort)(byte)pcVar5[uVar29 & 0xff]);
              uVar27 = uVar27 + 1;
            } while (uVar42 != uVar27);
          }
          break;
        case 3:
          pcVar5 = (&(ps[6].vt)->name)[lVar41];
          uVar3 = *(undefined4 *)pcVar5;
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar48._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar48[3] = uVar53;
          auVar48[2] = uVar53;
          auVar48[0] = (undefined1)uVar3;
          auVar48[1] = auVar48[0];
          auVar48._8_8_ = 0;
          auVar51 = pshuflw(auVar48,auVar48,0);
          uVar3 = *(undefined4 *)(pcVar5 + 8);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar64._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar64[3] = uVar53;
          auVar64[2] = uVar53;
          auVar64[0] = (undefined1)uVar3;
          auVar64[1] = auVar64[0];
          auVar64._8_8_ = 0;
          auVar67 = pshuflw(auVar64,auVar64,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x10);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar69._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar69[3] = uVar53;
          auVar69[2] = uVar53;
          auVar69[0] = (undefined1)uVar3;
          auVar69[1] = auVar69[0];
          auVar69._8_8_ = 0;
          auVar71 = pshuflw(auVar69,auVar69,0);
          cVar43 = *(char *)&ppVar28->name;
          cVar52 = *(char *)((long)&ppVar28->name + 1);
          cVar55 = *(char *)((long)&ppVar28->name + 2);
          cVar58 = *(char *)((long)&ppVar28->name + 3);
          cVar72 = *(char *)((long)&ppVar28->name + 4);
          cVar73 = *(char *)((long)&ppVar28->name + 5);
          cVar74 = *(char *)((long)&ppVar28->name + 6);
          cVar75 = *(char *)((long)&ppVar28->name + 7);
          cVar76 = *(char *)&ppVar28->frame_eval;
          cVar77 = *(undefined1 *)((long)&ppVar28->frame_eval + 1);
          cVar78 = *(undefined1 *)((long)&ppVar28->frame_eval + 2);
          cVar79 = *(undefined1 *)((long)&ppVar28->frame_eval + 3);
          cVar80 = *(undefined1 *)((long)&ppVar28->frame_eval + 4);
          cVar81 = *(undefined1 *)((long)&ppVar28->frame_eval + 5);
          cVar82 = *(undefined1 *)((long)&ppVar28->frame_eval + 6);
          cVar83 = *(undefined1 *)((long)&ppVar28->frame_eval + 7);
          cVar44 = auVar51[0];
          cVar54 = auVar51[1];
          cVar57 = auVar51[2];
          cVar60 = auVar51[3];
          local_c8[1] = cVar54 + cVar52;
          local_c8[0] = cVar44 + cVar43;
          local_c8[2] = cVar57 + cVar55;
          local_c8[3] = cVar60 + cVar58;
          local_c8[4] = cVar44 + cVar72;
          local_c8[5] = cVar54 + cVar73;
          local_c8[6] = cVar57 + cVar74;
          local_c8[7] = cVar60 + cVar75;
          local_c8[8] = cVar44 + cVar76;
          local_c8[9] = cVar54 + cVar77;
          local_c8[10] = cVar57 + cVar78;
          local_c8[0xb] = cVar60 + cVar79;
          local_c8[0xc] = cVar44 + cVar80;
          local_c8[0xd] = cVar54 + cVar81;
          local_c8[0xe] = cVar57 + cVar82;
          local_c8[0xf] = cVar60 + cVar83;
          cVar44 = auVar67[0];
          local_b8[0] = cVar44 + cVar43;
          cVar54 = auVar67[1];
          local_b8[1] = cVar54 + cVar52;
          cVar57 = auVar67[2];
          local_b8[2] = cVar57 + cVar55;
          cVar60 = auVar67[3];
          local_b8[3] = cVar60 + cVar58;
          local_b8[4] = cVar44 + cVar72;
          local_b8[5] = cVar54 + cVar73;
          local_b8[6] = cVar57 + cVar74;
          local_b8[7] = cVar60 + cVar75;
          local_b8[8] = cVar44 + cVar76;
          local_b8[9] = cVar54 + cVar77;
          local_b8[10] = cVar57 + cVar78;
          local_b8[0xb] = cVar60 + cVar79;
          local_b8[0xc] = cVar44 + cVar80;
          local_b8[0xd] = cVar54 + cVar81;
          local_b8[0xe] = cVar57 + cVar82;
          local_b8[0xf] = cVar60 + cVar83;
          cVar44 = auVar71[0];
          local_a8[0] = cVar44 + cVar43;
          cVar43 = auVar71[1];
          local_a8[1] = cVar43 + cVar52;
          cVar52 = auVar71[2];
          local_a8[2] = cVar52 + cVar55;
          cVar55 = auVar71[3];
          local_a8[3] = cVar55 + cVar58;
          local_a8[4] = cVar44 + cVar72;
          local_a8[5] = cVar43 + cVar73;
          local_a8[6] = cVar52 + cVar74;
          local_a8[7] = cVar55 + cVar75;
          local_a8[8] = cVar44 + cVar76;
          local_a8[9] = cVar43 + cVar77;
          local_a8[10] = cVar52 + cVar78;
          local_a8[0xb] = cVar55 + cVar79;
          local_a8[0xc] = cVar44 + cVar80;
          local_a8[0xd] = cVar43 + cVar81;
          local_a8[0xe] = cVar52 + cVar82;
          local_a8[0xf] = cVar55 + cVar83;
          if (0 < n_senone_active) {
            pcVar9 = (&(ps[2].vt)->name)[lVar41];
            lVar15 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 4) * 8);
            lVar33 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0xc) * 8);
            lVar22 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x14) * 8);
            pcVar5 = (ps[7].vt)->name;
            uVar27 = 0;
            uVar16 = 0;
            do {
              uVar16 = senone_active[uVar27] + uVar16;
              uVar31 = (ulong)(uVar16 >> 1);
              if ((uVar16 & 1) == 0) {
                bVar19 = local_c8[*(byte *)(lVar15 + uVar31) & 0xf];
                bVar18 = local_b8[*(byte *)(lVar33 + uVar31) & 0xf];
                iVar39 = (uint)bVar19 - (uint)bVar18;
                if ((uint)bVar19 < (uint)bVar18) {
                  bVar18 = bVar19;
                }
                bVar19 = (byte)iVar39;
                bVar32 = -bVar19;
                if (0 < iVar39) {
                  bVar32 = bVar19;
                }
                uVar29 = (uint)bVar18 - (uint)(byte)pcVar5[bVar32];
                bVar19 = *(byte *)(lVar22 + uVar31) & 0xf;
              }
              else {
                bVar19 = local_c8[*(byte *)(lVar15 + uVar31) >> 4];
                bVar18 = local_b8[*(byte *)(lVar33 + uVar31) >> 4];
                iVar39 = (uint)bVar19 - (uint)bVar18;
                if ((uint)bVar19 < (uint)bVar18) {
                  bVar18 = bVar19;
                }
                bVar19 = (byte)iVar39;
                bVar32 = -bVar19;
                if (0 < iVar39) {
                  bVar32 = bVar19;
                }
                uVar29 = (uint)bVar18 - (uint)(byte)pcVar5[bVar32];
                bVar19 = *(byte *)(lVar22 + uVar31) >> 4;
              }
              bVar19 = local_a8[bVar19];
              uVar23 = uVar29 - bVar19;
              uVar37 = (uint)bVar19;
              if ((int)uVar29 < (int)(uint)bVar19) {
                uVar37 = uVar29;
              }
              uVar29 = -uVar23;
              if (0 < (int)uVar23) {
                uVar29 = uVar23;
              }
              senone_scores[uVar16] =
                   senone_scores[uVar16] + ((short)uVar37 - (ushort)(byte)pcVar5[uVar29]);
              uVar27 = uVar27 + 1;
            } while (uVar42 != uVar27);
          }
          break;
        case 4:
          pcVar5 = (&(ps[6].vt)->name)[lVar41];
          uVar3 = *(undefined4 *)pcVar5;
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar49._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar49[3] = uVar53;
          auVar49[2] = uVar53;
          auVar49[0] = (undefined1)uVar3;
          auVar49[1] = auVar49[0];
          auVar49._8_8_ = 0;
          auVar51 = pshuflw(auVar49,auVar49,0);
          uVar3 = *(undefined4 *)(pcVar5 + 8);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar65._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar65[3] = uVar53;
          auVar65[2] = uVar53;
          auVar65[0] = (undefined1)uVar3;
          auVar65[1] = auVar65[0];
          auVar65._8_8_ = 0;
          auVar67 = pshuflw(auVar65,auVar65,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x10);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar70._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar70[3] = uVar53;
          auVar70[2] = uVar53;
          auVar70[0] = (undefined1)uVar3;
          auVar70[1] = auVar70[0];
          auVar70._8_8_ = 0;
          auVar71 = pshuflw(auVar70,auVar70,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x18);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar85._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar85[3] = uVar53;
          auVar85[2] = uVar53;
          auVar85[0] = (undefined1)uVar3;
          auVar85[1] = auVar85[0];
          auVar85._8_8_ = 0;
          auVar86 = pshuflw(auVar85,auVar85,0);
          cVar43 = *(char *)&ppVar28->name;
          cVar52 = *(char *)((long)&ppVar28->name + 1);
          cVar55 = *(char *)((long)&ppVar28->name + 2);
          cVar58 = *(char *)((long)&ppVar28->name + 3);
          cVar72 = *(char *)((long)&ppVar28->name + 4);
          cVar73 = *(char *)((long)&ppVar28->name + 5);
          cVar74 = *(char *)((long)&ppVar28->name + 6);
          cVar75 = *(char *)((long)&ppVar28->name + 7);
          cVar76 = *(char *)&ppVar28->frame_eval;
          cVar77 = *(undefined1 *)((long)&ppVar28->frame_eval + 1);
          cVar78 = *(undefined1 *)((long)&ppVar28->frame_eval + 2);
          cVar79 = *(undefined1 *)((long)&ppVar28->frame_eval + 3);
          cVar80 = *(undefined1 *)((long)&ppVar28->frame_eval + 4);
          cVar81 = *(undefined1 *)((long)&ppVar28->frame_eval + 5);
          cVar82 = *(undefined1 *)((long)&ppVar28->frame_eval + 6);
          cVar83 = *(undefined1 *)((long)&ppVar28->frame_eval + 7);
          cVar44 = auVar51[0];
          cVar54 = auVar51[1];
          cVar57 = auVar51[2];
          cVar60 = auVar51[3];
          local_c8[1] = cVar54 + cVar52;
          local_c8[0] = cVar44 + cVar43;
          local_c8[2] = cVar57 + cVar55;
          local_c8[3] = cVar60 + cVar58;
          local_c8[4] = cVar44 + cVar72;
          local_c8[5] = cVar54 + cVar73;
          local_c8[6] = cVar57 + cVar74;
          local_c8[7] = cVar60 + cVar75;
          local_c8[8] = cVar44 + cVar76;
          local_c8[9] = cVar54 + cVar77;
          local_c8[10] = cVar57 + cVar78;
          local_c8[0xb] = cVar60 + cVar79;
          local_c8[0xc] = cVar44 + cVar80;
          local_c8[0xd] = cVar54 + cVar81;
          local_c8[0xe] = cVar57 + cVar82;
          local_c8[0xf] = cVar60 + cVar83;
          cVar44 = auVar67[0];
          local_b8[0] = cVar44 + cVar43;
          cVar54 = auVar67[1];
          local_b8[1] = cVar54 + cVar52;
          cVar57 = auVar67[2];
          local_b8[2] = cVar57 + cVar55;
          cVar60 = auVar67[3];
          local_b8[3] = cVar60 + cVar58;
          local_b8[4] = cVar44 + cVar72;
          local_b8[5] = cVar54 + cVar73;
          local_b8[6] = cVar57 + cVar74;
          local_b8[7] = cVar60 + cVar75;
          local_b8[8] = cVar44 + cVar76;
          local_b8[9] = cVar54 + cVar77;
          local_b8[10] = cVar57 + cVar78;
          local_b8[0xb] = cVar60 + cVar79;
          local_b8[0xc] = cVar44 + cVar80;
          local_b8[0xd] = cVar54 + cVar81;
          local_b8[0xe] = cVar57 + cVar82;
          local_b8[0xf] = cVar60 + cVar83;
          cVar44 = auVar71[0];
          local_a8[0] = cVar44 + cVar43;
          cVar54 = auVar71[1];
          local_a8[1] = cVar54 + cVar52;
          cVar57 = auVar71[2];
          local_a8[2] = cVar57 + cVar55;
          cVar60 = auVar71[3];
          local_a8[3] = cVar60 + cVar58;
          local_a8[4] = cVar44 + cVar72;
          local_a8[5] = cVar54 + cVar73;
          local_a8[6] = cVar57 + cVar74;
          local_a8[7] = cVar60 + cVar75;
          local_a8[8] = cVar44 + cVar76;
          local_a8[9] = cVar54 + cVar77;
          local_a8[10] = cVar57 + cVar78;
          local_a8[0xb] = cVar60 + cVar79;
          local_a8[0xc] = cVar44 + cVar80;
          local_a8[0xd] = cVar54 + cVar81;
          local_a8[0xe] = cVar57 + cVar82;
          local_a8[0xf] = cVar60 + cVar83;
          cVar44 = auVar86[0];
          cVar54 = auVar86[1];
          cVar57 = auVar86[2];
          cVar60 = auVar86[3];
          local_98[0] = cVar44 + cVar43;
          local_98[1] = cVar54 + cVar52;
          local_98[2] = cVar57 + cVar55;
          local_98[3] = cVar60 + cVar58;
          local_98[4] = cVar44 + cVar72;
          local_98[5] = cVar54 + cVar73;
          local_98[6] = cVar57 + cVar74;
          local_98[7] = cVar60 + cVar75;
          local_98[8] = cVar44 + cVar76;
          local_98[9] = cVar54 + cVar77;
          local_98[10] = cVar57 + cVar78;
          local_98[0xb] = cVar60 + cVar79;
          local_98[0xc] = cVar44 + cVar80;
          local_98[0xd] = cVar54 + cVar81;
          local_98[0xe] = cVar57 + cVar82;
          cStack_89 = cVar60 + cVar83;
          if (0 < n_senone_active) {
            pcVar9 = (&(ps[2].vt)->name)[lVar41];
            lVar15 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 4) * 8);
            lVar33 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0xc) * 8);
            lVar22 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x14) * 8);
            lVar38 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x1c) * 8);
            pcVar5 = (ps[7].vt)->name;
            uVar27 = 0;
            uVar16 = 0;
            do {
              uVar16 = senone_active[uVar27] + uVar16;
              uVar31 = (ulong)(uVar16 >> 1);
              if ((uVar16 & 1) == 0) {
                bVar19 = local_b8[*(byte *)(lVar33 + uVar31) & 0xf];
                uVar37 = (uint)(byte)local_c8[*(byte *)(lVar15 + uVar31) & 0xf];
                iVar39 = uVar37 - bVar19;
                uVar29 = (uint)bVar19;
                if (uVar37 < bVar19) {
                  uVar29 = uVar37;
                }
                bVar19 = (byte)iVar39;
                bVar18 = -bVar19;
                if (0 < iVar39) {
                  bVar18 = bVar19;
                }
                uVar29 = uVar29 - (byte)pcVar5[bVar18];
                bVar19 = local_a8[*(byte *)(lVar22 + uVar31) & 0xf];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = *(byte *)(lVar38 + uVar31) & 0xf;
              }
              else {
                bVar19 = local_b8[*(byte *)(lVar33 + uVar31) >> 4];
                uVar37 = (uint)(byte)local_c8[*(byte *)(lVar15 + uVar31) >> 4];
                iVar39 = uVar37 - bVar19;
                uVar29 = (uint)bVar19;
                if (uVar37 < bVar19) {
                  uVar29 = uVar37;
                }
                bVar19 = (byte)iVar39;
                bVar18 = -bVar19;
                if (0 < iVar39) {
                  bVar18 = bVar19;
                }
                uVar29 = uVar29 - (byte)pcVar5[bVar18];
                bVar19 = local_a8[*(byte *)(lVar22 + uVar31) >> 4];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = *(byte *)(lVar38 + uVar31) >> 4;
              }
              bVar19 = local_98[bVar19];
              uVar23 = uVar29 - bVar19;
              uVar37 = (uint)bVar19;
              if ((int)uVar29 < (int)(uint)bVar19) {
                uVar37 = uVar29;
              }
              uVar29 = -uVar23;
              if (0 < (int)uVar23) {
                uVar29 = uVar23;
              }
              senone_scores[uVar16] =
                   senone_scores[uVar16] + ((short)uVar37 - (ushort)(byte)pcVar5[uVar29]);
              uVar27 = uVar27 + 1;
            } while (uVar42 != uVar27);
          }
          break;
        case 5:
          pcVar5 = (&(ps[6].vt)->name)[lVar41];
          uVar3 = *(undefined4 *)pcVar5;
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar47._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar47[3] = uVar53;
          auVar47[2] = uVar53;
          auVar47[0] = (undefined1)uVar3;
          auVar47[1] = auVar47[0];
          auVar47._8_8_ = 0;
          auVar51 = pshuflw(auVar47,auVar47,0);
          uVar3 = *(undefined4 *)(pcVar5 + 8);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar63._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar63[3] = uVar53;
          auVar63[2] = uVar53;
          auVar63[0] = (undefined1)uVar3;
          auVar63[1] = auVar63[0];
          auVar63._8_8_ = 0;
          auVar67 = pshuflw(auVar63,auVar63,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x10);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar68._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar68[3] = uVar53;
          auVar68[2] = uVar53;
          auVar68[0] = (undefined1)uVar3;
          auVar68[1] = auVar68[0];
          auVar68._8_8_ = 0;
          auVar71 = pshuflw(auVar68,auVar68,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x18);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar84._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar84[3] = uVar53;
          auVar84[2] = uVar53;
          auVar84[0] = (undefined1)uVar3;
          auVar84[1] = auVar84[0];
          auVar84._8_8_ = 0;
          auVar86 = pshuflw(auVar84,auVar84,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x20);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar87._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar87[3] = uVar53;
          auVar87[2] = uVar53;
          auVar87[0] = (undefined1)uVar3;
          auVar87[1] = auVar87[0];
          auVar87._8_8_ = 0;
          auVar88 = pshuflw(auVar87,auVar87,0);
          cVar43 = *(char *)&ppVar28->name;
          cVar52 = *(char *)((long)&ppVar28->name + 1);
          cVar55 = *(char *)((long)&ppVar28->name + 2);
          cVar58 = *(char *)((long)&ppVar28->name + 3);
          cVar72 = *(char *)((long)&ppVar28->name + 4);
          cVar73 = *(char *)((long)&ppVar28->name + 5);
          cVar74 = *(char *)((long)&ppVar28->name + 6);
          cVar75 = *(char *)((long)&ppVar28->name + 7);
          cVar76 = *(char *)&ppVar28->frame_eval;
          cVar77 = *(undefined1 *)((long)&ppVar28->frame_eval + 1);
          cVar78 = *(undefined1 *)((long)&ppVar28->frame_eval + 2);
          cVar79 = *(undefined1 *)((long)&ppVar28->frame_eval + 3);
          cVar80 = *(undefined1 *)((long)&ppVar28->frame_eval + 4);
          cVar81 = *(undefined1 *)((long)&ppVar28->frame_eval + 5);
          cVar82 = *(undefined1 *)((long)&ppVar28->frame_eval + 6);
          cVar83 = *(undefined1 *)((long)&ppVar28->frame_eval + 7);
          cVar44 = auVar51[0];
          cVar54 = auVar51[1];
          cVar57 = auVar51[2];
          cVar60 = auVar51[3];
          local_c8[1] = cVar54 + cVar52;
          local_c8[0] = cVar44 + cVar43;
          local_c8[2] = cVar57 + cVar55;
          local_c8[3] = cVar60 + cVar58;
          local_c8[4] = cVar44 + cVar72;
          local_c8[5] = cVar54 + cVar73;
          local_c8[6] = cVar57 + cVar74;
          local_c8[7] = cVar60 + cVar75;
          local_c8[8] = cVar44 + cVar76;
          local_c8[9] = cVar54 + cVar77;
          local_c8[10] = cVar57 + cVar78;
          local_c8[0xb] = cVar60 + cVar79;
          local_c8[0xc] = cVar44 + cVar80;
          local_c8[0xd] = cVar54 + cVar81;
          local_c8[0xe] = cVar57 + cVar82;
          local_c8[0xf] = cVar60 + cVar83;
          cVar44 = auVar67[0];
          local_b8[0] = cVar44 + cVar43;
          cVar54 = auVar67[1];
          local_b8[1] = cVar54 + cVar52;
          cVar57 = auVar67[2];
          local_b8[2] = cVar57 + cVar55;
          cVar60 = auVar67[3];
          local_b8[3] = cVar60 + cVar58;
          local_b8[4] = cVar44 + cVar72;
          local_b8[5] = cVar54 + cVar73;
          local_b8[6] = cVar57 + cVar74;
          local_b8[7] = cVar60 + cVar75;
          local_b8[8] = cVar44 + cVar76;
          local_b8[9] = cVar54 + cVar77;
          local_b8[10] = cVar57 + cVar78;
          local_b8[0xb] = cVar60 + cVar79;
          local_b8[0xc] = cVar44 + cVar80;
          local_b8[0xd] = cVar54 + cVar81;
          local_b8[0xe] = cVar57 + cVar82;
          local_b8[0xf] = cVar60 + cVar83;
          cVar44 = auVar71[0];
          local_a8[0] = cVar44 + cVar43;
          cVar54 = auVar71[1];
          local_a8[1] = cVar54 + cVar52;
          cVar57 = auVar71[2];
          local_a8[2] = cVar57 + cVar55;
          cVar60 = auVar71[3];
          local_a8[3] = cVar60 + cVar58;
          local_a8[4] = cVar44 + cVar72;
          local_a8[5] = cVar54 + cVar73;
          local_a8[6] = cVar57 + cVar74;
          local_a8[7] = cVar60 + cVar75;
          local_a8[8] = cVar44 + cVar76;
          local_a8[9] = cVar54 + cVar77;
          local_a8[10] = cVar57 + cVar78;
          local_a8[0xb] = cVar60 + cVar79;
          local_a8[0xc] = cVar44 + cVar80;
          local_a8[0xd] = cVar54 + cVar81;
          local_a8[0xe] = cVar57 + cVar82;
          local_a8[0xf] = cVar60 + cVar83;
          cVar44 = auVar86[0];
          cVar54 = auVar86[1];
          cVar57 = auVar86[2];
          cVar60 = auVar86[3];
          local_98[0] = cVar44 + cVar43;
          local_98[1] = cVar54 + cVar52;
          local_98[2] = cVar57 + cVar55;
          local_98[3] = cVar60 + cVar58;
          local_98[4] = cVar44 + cVar72;
          local_98[5] = cVar54 + cVar73;
          local_98[6] = cVar57 + cVar74;
          local_98[7] = cVar60 + cVar75;
          local_98[8] = cVar44 + cVar76;
          local_98[9] = cVar54 + cVar77;
          local_98[10] = cVar57 + cVar78;
          local_98[0xb] = cVar60 + cVar79;
          local_98[0xc] = cVar44 + cVar80;
          local_98[0xd] = cVar54 + cVar81;
          local_98[0xe] = cVar57 + cVar82;
          cStack_89 = cVar60 + cVar83;
          cVar44 = auVar88[0];
          cVar54 = auVar88[1];
          cVar57 = auVar88[2];
          cVar60 = auVar88[3];
          local_88[0] = cVar44 + cVar43;
          local_88[1] = cVar54 + cVar52;
          local_88[2] = cVar57 + cVar55;
          local_88[3] = cVar60 + cVar58;
          local_88[4] = cVar44 + cVar72;
          local_88[5] = cVar54 + cVar73;
          local_88[6] = cVar57 + cVar74;
          local_88[7] = cVar60 + cVar75;
          local_88[8] = cVar44 + cVar76;
          local_88[9] = cVar54 + cVar77;
          local_88[10] = cVar57 + cVar78;
          local_88[0xb] = cVar60 + cVar79;
          local_88[0xc] = cVar44 + cVar80;
          local_88[0xd] = cVar54 + cVar81;
          local_88[0xe] = cVar57 + cVar82;
          cStack_79 = cVar60 + cVar83;
          if (0 < n_senone_active) {
            pcVar9 = (&(ps[2].vt)->name)[lVar41];
            lVar15 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 4) * 8);
            lVar33 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0xc) * 8);
            lVar22 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x14) * 8);
            lVar38 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x1c) * 8);
            lVar10 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x24) * 8);
            pcVar5 = (ps[7].vt)->name;
            uVar27 = 0;
            uVar16 = 0;
            do {
              uVar16 = senone_active[uVar27] + uVar16;
              uVar31 = (ulong)(uVar16 >> 1);
              if ((uVar16 & 1) == 0) {
                bVar19 = local_c8[*(byte *)(lVar15 + uVar31) & 0xf];
                bVar18 = local_b8[*(byte *)(lVar33 + uVar31) & 0xf];
                uVar29 = (uint)bVar19 - (uint)bVar18;
                if ((uint)bVar19 < (uint)bVar18) {
                  bVar18 = bVar19;
                }
                uVar37 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar37 = uVar29;
                }
                uVar29 = (uint)bVar18 - (uint)(byte)pcVar5[(ulong)uVar37 & 0xff];
                bVar19 = local_a8[*(byte *)(lVar22 + uVar31) & 0xf];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = local_98[*(byte *)(lVar38 + uVar31) & 0xf];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = *(byte *)(lVar10 + uVar31) & 0xf;
              }
              else {
                bVar19 = local_c8[*(byte *)(lVar15 + uVar31) >> 4];
                bVar18 = local_b8[*(byte *)(lVar33 + uVar31) >> 4];
                uVar29 = (uint)bVar19 - (uint)bVar18;
                if ((uint)bVar19 < (uint)bVar18) {
                  bVar18 = bVar19;
                }
                uVar37 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar37 = uVar29;
                }
                uVar29 = (uint)bVar18 - (uint)(byte)pcVar5[(ulong)uVar37 & 0xff];
                bVar19 = local_a8[*(byte *)(lVar22 + uVar31) >> 4];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = local_98[*(byte *)(lVar38 + uVar31) >> 4];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = *(byte *)(lVar10 + uVar31) >> 4;
              }
              bVar19 = local_88[bVar19];
              uVar23 = uVar29 - bVar19;
              uVar37 = (uint)bVar19;
              if ((int)uVar29 < (int)(uint)bVar19) {
                uVar37 = uVar29;
              }
              uVar29 = -uVar23;
              if (0 < (int)uVar23) {
                uVar29 = uVar23;
              }
              senone_scores[uVar16] =
                   senone_scores[uVar16] + ((short)uVar37 - (ushort)(byte)pcVar5[uVar29]);
              uVar27 = uVar27 + 1;
            } while (uVar42 != uVar27);
          }
          break;
        case 6:
          pcVar5 = (&(ps[6].vt)->name)[lVar41];
          uVar3 = *(undefined4 *)pcVar5;
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar51._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar51[3] = uVar53;
          auVar51[2] = uVar53;
          auVar51[0] = (undefined1)uVar3;
          auVar51[1] = auVar51[0];
          auVar51._8_8_ = 0;
          auVar51 = pshuflw(auVar51,auVar51,0);
          uVar3 = *(undefined4 *)(pcVar5 + 8);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar67._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar67[3] = uVar53;
          auVar67[2] = uVar53;
          auVar67[0] = (undefined1)uVar3;
          auVar67[1] = auVar67[0];
          auVar67._8_8_ = 0;
          auVar67 = pshuflw(auVar67,auVar67,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x10);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar71._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar71[3] = uVar53;
          auVar71[2] = uVar53;
          auVar71[0] = (undefined1)uVar3;
          auVar71[1] = auVar71[0];
          auVar71._8_8_ = 0;
          auVar71 = pshuflw(auVar71,auVar71,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x18);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar86._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar86[3] = uVar53;
          auVar86[2] = uVar53;
          auVar86[0] = (undefined1)uVar3;
          auVar86[1] = auVar86[0];
          auVar86._8_8_ = 0;
          auVar86 = pshuflw(auVar86,auVar86,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x20);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar88._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar88[3] = uVar53;
          auVar88[2] = uVar53;
          auVar88[0] = (undefined1)uVar3;
          auVar88[1] = auVar88[0];
          auVar88._8_8_ = 0;
          auVar88 = pshuflw(auVar88,auVar88,0);
          uVar3 = *(undefined4 *)(pcVar5 + 0x28);
          uVar59 = (undefined1)((uint)uVar3 >> 0x18);
          uVar56 = (undefined1)((uint)uVar3 >> 0x10);
          uVar53 = (undefined1)((uint)uVar3 >> 8);
          auVar89._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar59,uVar59),uVar56),CONCAT14(uVar56,uVar3)) >>
                    0x20);
          auVar89[3] = uVar53;
          auVar89[2] = uVar53;
          auVar89[0] = (undefined1)uVar3;
          auVar89[1] = auVar89[0];
          auVar89._8_8_ = 0;
          auVar89 = pshuflw(auVar89,auVar89,0);
          cVar43 = *(char *)&ppVar28->name;
          cVar52 = *(char *)((long)&ppVar28->name + 1);
          cVar55 = *(char *)((long)&ppVar28->name + 2);
          cVar58 = *(char *)((long)&ppVar28->name + 3);
          cVar72 = *(char *)((long)&ppVar28->name + 4);
          cVar73 = *(char *)((long)&ppVar28->name + 5);
          cVar74 = *(char *)((long)&ppVar28->name + 6);
          cVar75 = *(char *)((long)&ppVar28->name + 7);
          cVar76 = *(char *)&ppVar28->frame_eval;
          cVar77 = *(undefined1 *)((long)&ppVar28->frame_eval + 1);
          cVar78 = *(undefined1 *)((long)&ppVar28->frame_eval + 2);
          cVar79 = *(undefined1 *)((long)&ppVar28->frame_eval + 3);
          cVar80 = *(undefined1 *)((long)&ppVar28->frame_eval + 4);
          cVar81 = *(undefined1 *)((long)&ppVar28->frame_eval + 5);
          cVar82 = *(undefined1 *)((long)&ppVar28->frame_eval + 6);
          cVar83 = *(undefined1 *)((long)&ppVar28->frame_eval + 7);
          cVar44 = auVar51[0];
          cVar54 = auVar51[1];
          cVar57 = auVar51[2];
          cVar60 = auVar51[3];
          local_c8[1] = cVar54 + cVar52;
          local_c8[0] = cVar44 + cVar43;
          local_c8[2] = cVar57 + cVar55;
          local_c8[3] = cVar60 + cVar58;
          local_c8[4] = cVar44 + cVar72;
          local_c8[5] = cVar54 + cVar73;
          local_c8[6] = cVar57 + cVar74;
          local_c8[7] = cVar60 + cVar75;
          local_c8[8] = cVar44 + cVar76;
          local_c8[9] = cVar54 + cVar77;
          local_c8[10] = cVar57 + cVar78;
          local_c8[0xb] = cVar60 + cVar79;
          local_c8[0xc] = cVar44 + cVar80;
          local_c8[0xd] = cVar54 + cVar81;
          local_c8[0xe] = cVar57 + cVar82;
          local_c8[0xf] = cVar60 + cVar83;
          cVar44 = auVar67[0];
          local_b8[0] = cVar44 + cVar43;
          cVar54 = auVar67[1];
          local_b8[1] = cVar54 + cVar52;
          cVar57 = auVar67[2];
          local_b8[2] = cVar57 + cVar55;
          cVar60 = auVar67[3];
          local_b8[3] = cVar60 + cVar58;
          local_b8[4] = cVar44 + cVar72;
          local_b8[5] = cVar54 + cVar73;
          local_b8[6] = cVar57 + cVar74;
          local_b8[7] = cVar60 + cVar75;
          local_b8[8] = cVar44 + cVar76;
          local_b8[9] = cVar54 + cVar77;
          local_b8[10] = cVar57 + cVar78;
          local_b8[0xb] = cVar60 + cVar79;
          local_b8[0xc] = cVar44 + cVar80;
          local_b8[0xd] = cVar54 + cVar81;
          local_b8[0xe] = cVar57 + cVar82;
          local_b8[0xf] = cVar60 + cVar83;
          cVar44 = auVar71[0];
          local_a8[0] = cVar44 + cVar43;
          cVar54 = auVar71[1];
          local_a8[1] = cVar54 + cVar52;
          cVar57 = auVar71[2];
          local_a8[2] = cVar57 + cVar55;
          cVar60 = auVar71[3];
          local_a8[3] = cVar60 + cVar58;
          local_a8[4] = cVar44 + cVar72;
          local_a8[5] = cVar54 + cVar73;
          local_a8[6] = cVar57 + cVar74;
          local_a8[7] = cVar60 + cVar75;
          local_a8[8] = cVar44 + cVar76;
          local_a8[9] = cVar54 + cVar77;
          local_a8[10] = cVar57 + cVar78;
          local_a8[0xb] = cVar60 + cVar79;
          local_a8[0xc] = cVar44 + cVar80;
          local_a8[0xd] = cVar54 + cVar81;
          local_a8[0xe] = cVar57 + cVar82;
          local_a8[0xf] = cVar60 + cVar83;
          cVar44 = auVar86[0];
          cVar54 = auVar86[1];
          cVar57 = auVar86[2];
          cVar60 = auVar86[3];
          local_98[0] = cVar44 + cVar43;
          local_98[1] = cVar54 + cVar52;
          local_98[2] = cVar57 + cVar55;
          local_98[3] = cVar60 + cVar58;
          local_98[4] = cVar44 + cVar72;
          local_98[5] = cVar54 + cVar73;
          local_98[6] = cVar57 + cVar74;
          local_98[7] = cVar60 + cVar75;
          local_98[8] = cVar44 + cVar76;
          local_98[9] = cVar54 + cVar77;
          local_98[10] = cVar57 + cVar78;
          local_98[0xb] = cVar60 + cVar79;
          local_98[0xc] = cVar44 + cVar80;
          local_98[0xd] = cVar54 + cVar81;
          local_98[0xe] = cVar57 + cVar82;
          cStack_89 = cVar60 + cVar83;
          cVar44 = auVar88[0];
          cVar54 = auVar88[1];
          cVar57 = auVar88[2];
          cVar60 = auVar88[3];
          local_88[0] = cVar44 + cVar43;
          local_88[1] = cVar54 + cVar52;
          local_88[2] = cVar57 + cVar55;
          local_88[3] = cVar60 + cVar58;
          local_88[4] = cVar44 + cVar72;
          local_88[5] = cVar54 + cVar73;
          local_88[6] = cVar57 + cVar74;
          local_88[7] = cVar60 + cVar75;
          local_88[8] = cVar44 + cVar76;
          local_88[9] = cVar54 + cVar77;
          local_88[10] = cVar57 + cVar78;
          local_88[0xb] = cVar60 + cVar79;
          local_88[0xc] = cVar44 + cVar80;
          local_88[0xd] = cVar54 + cVar81;
          local_88[0xe] = cVar57 + cVar82;
          cStack_79 = cVar60 + cVar83;
          cVar44 = auVar89[0];
          cVar54 = auVar89[1];
          cVar57 = auVar89[2];
          cVar60 = auVar89[3];
          local_78[0] = cVar44 + cVar43;
          local_78[1] = cVar54 + cVar52;
          local_78[2] = cVar57 + cVar55;
          local_78[3] = cVar60 + cVar58;
          cStack_74 = cVar44 + cVar72;
          cStack_73 = cVar54 + cVar73;
          cStack_72 = cVar57 + cVar74;
          cStack_71 = cVar60 + cVar75;
          cStack_70 = cVar44 + cVar76;
          cStack_6f = cVar54 + cVar77;
          cStack_6e = cVar57 + cVar78;
          cStack_6d = cVar60 + cVar79;
          cStack_6c = cVar44 + cVar80;
          cStack_6b = cVar54 + cVar81;
          cStack_6a = cVar57 + cVar82;
          cStack_69 = cVar60 + cVar83;
          if (0 < n_senone_active) {
            pcVar9 = (&(ps[2].vt)->name)[lVar41];
            lVar15 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 4) * 8);
            lVar33 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0xc) * 8);
            lVar22 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x14) * 8);
            lVar38 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x1c) * 8);
            lVar10 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x24) * 8);
            lVar11 = *(long *)(pcVar9 + (long)*(int *)(pcVar5 + 0x2c) * 8);
            pcVar5 = (ps[7].vt)->name;
            uVar27 = 0;
            uVar16 = 0;
            do {
              uVar16 = senone_active[uVar27] + uVar16;
              uVar31 = (ulong)(uVar16 >> 1);
              if ((uVar16 & 1) == 0) {
                bVar19 = local_b8[*(byte *)(lVar33 + uVar31) & 0xf];
                uVar37 = (uint)(byte)local_c8[*(byte *)(lVar15 + uVar31) & 0xf];
                iVar39 = uVar37 - bVar19;
                uVar29 = (uint)bVar19;
                if (uVar37 < bVar19) {
                  uVar29 = uVar37;
                }
                bVar19 = (byte)iVar39;
                bVar18 = -bVar19;
                if (0 < iVar39) {
                  bVar18 = bVar19;
                }
                uVar29 = uVar29 - (byte)pcVar5[bVar18];
                bVar19 = local_a8[*(byte *)(lVar22 + uVar31) & 0xf];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = local_98[*(byte *)(lVar38 + uVar31) & 0xf];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = local_88[*(byte *)(lVar10 + uVar31) & 0xf];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = *(byte *)(lVar11 + uVar31) & 0xf;
              }
              else {
                bVar19 = local_b8[*(byte *)(lVar33 + uVar31) >> 4];
                uVar37 = (uint)(byte)local_c8[*(byte *)(lVar15 + uVar31) >> 4];
                iVar39 = uVar37 - bVar19;
                uVar29 = (uint)bVar19;
                if (uVar37 < bVar19) {
                  uVar29 = uVar37;
                }
                bVar19 = (byte)iVar39;
                bVar18 = -bVar19;
                if (0 < iVar39) {
                  bVar18 = bVar19;
                }
                uVar29 = uVar29 - (byte)pcVar5[bVar18];
                bVar19 = local_a8[*(byte *)(lVar22 + uVar31) >> 4];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = local_98[*(byte *)(lVar38 + uVar31) >> 4];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = local_88[*(byte *)(lVar10 + uVar31) >> 4];
                uVar37 = uVar29 - bVar19;
                if ((int)(uint)bVar19 <= (int)uVar29) {
                  uVar29 = (uint)bVar19;
                }
                uVar23 = -uVar37;
                if (0 < (int)uVar37) {
                  uVar23 = uVar37;
                }
                uVar29 = uVar29 - (byte)pcVar5[uVar23];
                bVar19 = *(byte *)(lVar11 + uVar31) >> 4;
              }
              bVar19 = local_78[bVar19];
              uVar23 = uVar29 - bVar19;
              uVar37 = (uint)bVar19;
              if ((int)uVar29 < (int)(uint)bVar19) {
                uVar37 = uVar29;
              }
              uVar29 = -uVar23;
              if (0 < (int)uVar23) {
                uVar29 = uVar23;
              }
              senone_scores[uVar16] =
                   senone_scores[uVar16] + ((short)uVar37 - (ushort)(byte)pcVar5[uVar29]);
              uVar27 = uVar27 + 1;
            } while (uVar42 != uVar27);
          }
          break;
        default:
          if (0 < n_senone_active) {
            pcVar5 = (&(ps[2].vt)->name)[lVar41];
            piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
            lVar15 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
            iVar39 = *piVar7;
            uVar27 = 0;
            uVar16 = 0;
            do {
              uVar16 = senone_active[uVar27] + uVar16;
              bVar18 = *(byte *)(lVar15 + (ulong)(uVar16 >> 1));
              bVar32 = bVar18 >> 4;
              if ((uVar16 & 1) == 0) {
                bVar32 = bVar18 & 0xf;
              }
              iVar25 = (uint)*(byte *)((long)&ppVar28->name + (ulong)bVar32) + iVar39;
              if (1 < bVar19) {
                lVar33 = 0;
                do {
                  bVar18 = *(byte *)(*(long *)(pcVar5 + (long)piVar7[lVar33 * 2 + 3] * 8) +
                                    (ulong)(uVar16 >> 1));
                  bVar32 = bVar18 >> 4;
                  if ((uVar16 & 1) == 0) {
                    bVar32 = bVar18 & 0xf;
                  }
                  iVar30 = (uint)*(byte *)((long)&ppVar28->name + (ulong)bVar32) +
                           piVar7[lVar33 * 2 + 2];
                  uVar29 = iVar25 - iVar30;
                  if (iVar25 < iVar30) {
                    iVar30 = iVar25;
                  }
                  uVar37 = -uVar29;
                  if (0 < (int)uVar29) {
                    uVar37 = uVar29;
                  }
                  iVar25 = iVar30 - (uint)(byte)(ps[7].vt)->name[uVar37];
                  lVar33 = lVar33 + 1;
                } while ((ulong)bVar19 - 1 != lVar33);
              }
              senone_scores[uVar16] = senone_scores[uVar16] + (short)iVar25;
              uVar27 = uVar27 + 1;
            } while (uVar27 != uVar42);
          }
        }
      }
      else {
        uVar16 = ps[3].frame_idx & 0xfffffffe;
        if (0 < (int)uVar16) {
          bVar19 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + lVar17 * 8) + lVar41);
          pcVar5 = (&(ps[2].vt)->name)[lVar41];
          piVar7 = (int *)(&(ps[6].vt)->name)[lVar41];
          local_60 = *(long *)(pcVar5 + (long)piVar7[1] * 8);
          iVar39 = *piVar7;
          uVar27 = 0;
          do {
            bVar18 = *(byte *)(local_60 + (uVar27 >> 1));
            iVar30 = (uint)*(byte *)((long)&ppVar28->name + (ulong)(bVar18 & 0xf)) + iVar39;
            iVar25 = (uint)*(byte *)((long)&ppVar28->name + (ulong)(bVar18 >> 4)) + iVar39;
            if (1 < bVar19) {
              pcVar9 = (ps[7].vt)->name;
              lVar15 = 0;
              do {
                bVar18 = *(byte *)(*(long *)(pcVar5 + (long)piVar7[lVar15 * 2 + 3] * 8) +
                                  (uVar27 >> 1));
                iVar20 = (uint)*(byte *)((long)&ppVar28->name + (ulong)(bVar18 & 0xf)) +
                         piVar7[lVar15 * 2 + 2];
                iVar35 = (uint)*(byte *)((long)&ppVar28->name + (ulong)(bVar18 >> 4)) +
                         piVar7[lVar15 * 2 + 2];
                uVar29 = iVar30 - iVar20;
                if (iVar30 < iVar20) {
                  iVar20 = iVar30;
                }
                uVar37 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar37 = uVar29;
                }
                iVar30 = iVar20 - (uint)(byte)pcVar9[uVar37];
                uVar29 = iVar25 - iVar35;
                if (iVar25 < iVar35) {
                  iVar35 = iVar25;
                }
                uVar37 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar37 = uVar29;
                }
                iVar25 = iVar35 - (uint)(byte)pcVar9[uVar37];
                lVar15 = lVar15 + 1;
              } while ((ulong)bVar19 - 1 != lVar15);
            }
            senone_scores[uVar27] = senone_scores[uVar27] + (short)iVar30;
            senone_scores[uVar27 + 1] = senone_scores[uVar27 + 1] + (short)iVar25;
            uVar27 = uVar27 + 2;
          } while (uVar27 < uVar16);
        }
      }
      lVar41 = lVar41 + 1;
    } while (lVar41 != local_38);
  }
  return 0;
}

Assistant:

int32
s2_semi_mgau_frame_eval(ps_mgau_t *ps,
                        int16 *senone_scores,
                        uint8 *senone_active,
                        int32 n_senone_active,
			mfcc_t ** featbuf, int32 frame,
			int32 compallsen)
{
    s2_semi_mgau_t *s = (s2_semi_mgau_t *)ps;
    int i, topn_idx;
    int n_feat = s->g->n_feat;

    memset(senone_scores, 0, s->n_sen * sizeof(*senone_scores));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= ps_mgau_base(ps)->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        if (s->mixw_cb) {
            if (compallsen)
                get_scores_4b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_4b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
        else {
            if (compallsen)
                get_scores_8b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
    }

    return 0;
}